

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

ssize_t gnu_sparse_10_read(archive_read *a,tar *tar,size_t *unconsumed)

{
  wchar_t wVar1;
  int64_t iVar2;
  archive_read *a_00;
  tar *tar_00;
  long lVar3;
  ulong request;
  ulong uVar4;
  long in_RSI;
  size_t *in_RDI;
  tar *unaff_retaddr;
  int64_t remaining;
  int64_t to_skip;
  int64_t size;
  int64_t offset;
  wchar_t entries;
  ssize_t bytes_read;
  size_t *in_stack_ffffffffffffffa8;
  tar *in_stack_ffffffffffffffb0;
  archive_read *a_01;
  int64_t in_stack_ffffffffffffffb8;
  ulong uVar5;
  int local_2c;
  int64_t *in_stack_fffffffffffffff8;
  
  gnu_clear_sparse_list(in_stack_ffffffffffffffb0);
  a_01 = *(archive_read **)(in_RSI + 0x110);
  iVar2 = gnu_sparse_10_atol((archive_read *)remaining,unaff_retaddr,in_stack_fffffffffffffff8,
                             in_RDI);
  local_2c = (int)iVar2;
  if (-1 < (int)iVar2) {
    do {
      if (local_2c < 1) {
        tar_flush_unconsumed(a_01,in_stack_ffffffffffffffa8);
        lVar3 = *(long *)(in_RSI + 0x110) - (long)a_01;
        request = -lVar3 & 0x1ff;
        uVar5 = request;
        uVar4 = __archive_read_consume(a_01,request);
        if (request == uVar4) {
          return lVar3 + uVar5;
        }
        return -0x1e;
      }
      a_00 = (archive_read *)
             gnu_sparse_10_atol((archive_read *)remaining,unaff_retaddr,in_stack_fffffffffffffff8,
                                in_RDI);
      if ((long)a_00 < 0) {
        return -0x1e;
      }
      tar_00 = (tar *)gnu_sparse_10_atol((archive_read *)remaining,unaff_retaddr,
                                         in_stack_fffffffffffffff8,in_RDI);
      if ((long)tar_00 < 0) {
        return -0x1e;
      }
      wVar1 = gnu_add_sparse_entry(a_00,tar_00,in_stack_ffffffffffffffb8,(int64_t)a_01);
      local_2c = local_2c + -1;
    } while (wVar1 == L'\0');
  }
  return -0x1e;
}

Assistant:

static ssize_t
gnu_sparse_10_read(struct archive_read *a, struct tar *tar, size_t *unconsumed)
{
	ssize_t bytes_read;
	int entries;
	int64_t offset, size, to_skip, remaining;

	/* Clear out the existing sparse list. */
	gnu_clear_sparse_list(tar);

	remaining = tar->entry_bytes_remaining;

	/* Parse entries. */
	entries = (int)gnu_sparse_10_atol(a, tar, &remaining, unconsumed);
	if (entries < 0)
		return (ARCHIVE_FATAL);
	/* Parse the individual entries. */
	while (entries-- > 0) {
		/* Parse offset/size */
		offset = gnu_sparse_10_atol(a, tar, &remaining, unconsumed);
		if (offset < 0)
			return (ARCHIVE_FATAL);
		size = gnu_sparse_10_atol(a, tar, &remaining, unconsumed);
		if (size < 0)
			return (ARCHIVE_FATAL);
		/* Add a new sparse entry. */
		if (gnu_add_sparse_entry(a, tar, offset, size) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}
	/* Skip rest of block... */
	tar_flush_unconsumed(a, unconsumed);
	bytes_read = (ssize_t)(tar->entry_bytes_remaining - remaining);
	to_skip = 0x1ff & -bytes_read;
	if (to_skip != __archive_read_consume(a, to_skip))
		return (ARCHIVE_FATAL);
	return ((ssize_t)(bytes_read + to_skip));
}